

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecChoice.c
# Opt level: O3

int Cec_ManCombSpecReal(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  
  if (((int)(uint)*(undefined8 *)pObj < 0) ||
     (uVar2 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar2 == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecChoice.c"
                  ,0x36,"int Cec_ManCombSpecReal(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
  }
  Cec_ManCombSpecReduce_rec(pNew,p,pObj + -(ulong)uVar2);
  Cec_ManCombSpecReduce_rec(pNew,p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff));
  uVar1 = *(ulong *)pObj;
  if ((-1 < (int)pObj[-(uVar1 & 0x1fffffff)].Value) &&
     (uVar2 = (uint)(uVar1 >> 0x20), -1 < (int)pObj[-(ulong)(uVar2 & 0x1fffffff)].Value)) {
    iVar3 = Gia_ManHashAnd(pNew,(uint)(uVar1 >> 0x1d) & 1 ^ pObj[-(uVar1 & 0x1fffffff)].Value,
                           pObj[-(ulong)(uVar2 & 0x1fffffff)].Value ^ uVar2 >> 0x1d & 1);
    return iVar3;
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                ,0xf5,"int Abc_LitNotCond(int, int)");
}

Assistant:

static inline int Cec_ManCombSpecReal( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj )
{
    assert( Gia_ObjIsAnd(pObj) );
    Cec_ManCombSpecReduce_rec( pNew, p, Gia_ObjFanin0(pObj) );
    Cec_ManCombSpecReduce_rec( pNew, p, Gia_ObjFanin1(pObj) );
    return Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
}